

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall
particleSamples::boostParticles
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *input_particle_list,double rap_shift)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  reference paVar4;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double p_mag;
  double pz_shifted;
  double E_shifted;
  anon_struct_120_15_f999644b *part_i;
  iterator __end2;
  iterator __begin2;
  vector<particle_info,_std::allocator<particle_info>_> *__range2;
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *__range1;
  vector<particle_info,_std::allocator<particle_info>_> *in_stack_ffffffffffffff58;
  __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
  local_48;
  vector<particle_info,_std::allocator<particle_info>_> *local_40;
  reference local_38;
  vector<particle_info,_std::allocator<particle_info>_> **local_30;
  __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
  local_28 [2];
  double local_18;
  
  local_18 = in_XMM0_Qa;
  local_28[0]._M_current =
       (vector<particle_info,_std::allocator<particle_info>_> **)
       std::
       vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
       ::begin((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                *)in_stack_ffffffffffffff58);
  local_30 = (vector<particle_info,_std::allocator<particle_info>_> **)
             std::
             vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             ::end((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar3) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
               ::operator*(local_28);
    local_40 = *local_38;
    local_48._M_current =
         (anon_struct_120_15_f999644b *)
         std::vector<particle_info,_std::allocator<particle_info>_>::begin
                   (in_stack_ffffffffffffff58);
    std::vector<particle_info,_std::allocator<particle_info>_>::end(in_stack_ffffffffffffff58);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff60,
                         (__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                          *)in_stack_ffffffffffffff58);
      if (!bVar3) break;
      paVar4 = __gnu_cxx::
               __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
               ::operator*(&local_48);
      dVar5 = sqrt(paVar4->px * paVar4->px + paVar4->py * paVar4->py);
      paVar4->pT = dVar5;
      dVar5 = atan2(paVar4->py,paVar4->px);
      paVar4->phi_p = dVar5;
      dVar5 = paVar4->E;
      dVar6 = cosh(local_18);
      in_stack_ffffffffffffff60 =
           (__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
            *)paVar4->pz;
      dVar7 = sinh(local_18);
      dVar7 = (double)in_stack_ffffffffffffff60 * dVar7;
      dVar1 = paVar4->pz;
      dVar8 = cosh(local_18);
      dVar2 = paVar4->E;
      dVar9 = sinh(local_18);
      paVar4->E = dVar5 * dVar6 + dVar7;
      paVar4->pz = dVar1 * dVar8 + dVar2 * dVar9;
      dVar5 = log((paVar4->E + paVar4->pz) / (paVar4->E - paVar4->pz));
      paVar4->rap_y = dVar5 * 0.5;
      dVar5 = sqrt(paVar4->pT * paVar4->pT + paVar4->pz * paVar4->pz);
      dVar5 = log((dVar5 + paVar4->pz) / (dVar5 - paVar4->pz));
      paVar4->rap_eta = dVar5 * 0.5;
      __gnu_cxx::
      __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
      ::operator++(&local_48);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
    ::operator++(local_28);
  }
  return;
}

Assistant:

void particleSamples::boostParticles(
    vector<vector<particle_info> *> *input_particle_list,
    const double rap_shift) {
    for (auto &ev_i : (*input_particle_list)) {
        for (auto &part_i : (*ev_i)) {
            part_i.pT = sqrt(part_i.px * part_i.px + part_i.py * part_i.py);
            part_i.phi_p = atan2(part_i.py, part_i.px);
            double E_shifted =
                (part_i.E * cosh(rap_shift) + part_i.pz * sinh(rap_shift));
            double pz_shifted =
                (part_i.pz * cosh(rap_shift) + part_i.E * sinh(rap_shift));
            part_i.E = E_shifted;
            part_i.pz = pz_shifted;

            part_i.rap_y =
                0.5 * log((part_i.E + part_i.pz) / (part_i.E - part_i.pz));
            double p_mag = sqrt(part_i.pT * part_i.pT + part_i.pz * part_i.pz);
            part_i.rap_eta =
                0.5 * log((p_mag + part_i.pz) / (p_mag - part_i.pz));
        }
    }
}